

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

size_t Curl_conn_get_max_concurrent(Curl_easy *data,connectdata *conn,int sockindex)

{
  Curl_cfilter *pCVar1;
  CURLcode CVar2;
  size_t sVar3;
  bool bVar4;
  int n;
  int local_c;
  
  local_c = 0;
  pCVar1 = conn->cfilter[sockindex];
  if (pCVar1 == (Curl_cfilter *)0x0) {
    bVar4 = true;
    local_c = 0;
  }
  else {
    CVar2 = (*pCVar1->cft->query)(pCVar1,data,1,&local_c,(void *)0x0);
    bVar4 = CVar2 != CURLE_OK;
  }
  sVar3 = (size_t)local_c;
  if (local_c < 1) {
    sVar3 = 1;
  }
  if (bVar4) {
    sVar3 = 1;
  }
  return sVar3;
}

Assistant:

size_t Curl_conn_get_max_concurrent(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     int sockindex)
{
  CURLcode result;
  int n = 0;

  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  result = cf ? cf->cft->query(cf, data, CF_QUERY_MAX_CONCURRENT,
                               &n, NULL) : CURLE_UNKNOWN_OPTION;
  return (result || n <= 0) ? 1 : (size_t)n;
}